

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_open(OPEN_HANDLE open)

{
  OPEN_INSTANCE *open_instance;
  AMQP_VALUE result;
  OPEN_HANDLE open_local;
  
  if (open == (OPEN_HANDLE)0x0) {
    open_instance = (OPEN_INSTANCE *)0x0;
  }
  else {
    open_instance = (OPEN_INSTANCE *)amqpvalue_clone(open->composite_value);
  }
  return (AMQP_VALUE)open_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_open(OPEN_HANDLE open)
{
    AMQP_VALUE result;

    if (open == NULL)
    {
        result = NULL;
    }
    else
    {
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        result = amqpvalue_clone(open_instance->composite_value);
    }

    return result;
}